

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyze.cpp
# Opt level: O0

void __thiscall CaDiCaL::Internal::learn_empty_clause(Internal *this)

{
  pointer piVar1;
  External *in_RDI;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *unaff_retaddr;
  uint64_t in_stack_00000008;
  Internal *in_stack_00000010;
  int64_t id;
  value_type_conflict5 *in_stack_ffffffffffffffd8;
  
  build_chain_for_empty(in_stack_00000010);
  External::check_learned_empty_clause(in_RDI);
  piVar1 = (pointer)((long)(in_RDI->assumptions).super__Vector_base<int,_std::allocator<int>_>.
                           _M_impl.super__Vector_impl_data._M_start + 1);
  (in_RDI->assumptions).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = piVar1;
  if (*(long *)&in_RDI[5].witness.super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset != 0) {
    Proof::add_derived_empty_clause((Proof *)in_stack_00000010,in_stack_00000008,unaff_retaddr);
  }
  *(undefined1 *)((long)&in_RDI->internal + 4) = 1;
  (in_RDI->constraint).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_start = piVar1;
  *(undefined1 *)
   ((long)&in_RDI[2].vals.super__Bvector_base<std::allocator<bool>_>._M_impl.
           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p + 1) = 1;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_RDI,
             in_stack_ffffffffffffffd8);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::clear
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0xd4318d);
  return;
}

Assistant:

void Internal::learn_empty_clause () {
  assert (!unsat);
  build_chain_for_empty ();
  LOG ("learned empty clause");
  external->check_learned_empty_clause ();
  int64_t id = ++clause_id;
  if (proof) {
    proof->add_derived_empty_clause (id, lrat_chain);
  }
  unsat = true;
  conflict_id = id;
  marked_failed = true;
  conclusion.push_back (id);
  lrat_chain.clear ();
}